

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phyr_math.h
# Opt level: O2

Mat4x4 * __thiscall phyr::_Mat4x4::operator*(_Mat4x4 *this,Mat4x4 *m)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double (*padVar5) [4];
  int i;
  long lVar6;
  double (*in_RDI) [4];
  int j;
  long lVar7;
  
  padVar5 = in_RDI;
  *(undefined8 *)((long)(in_RDI + 3) + 0x18) = 0x3ff0000000000000;
  in_RDI[2][2] = 1.0;
  in_RDI[1][1] = 1.0;
  (*in_RDI)[0] = 1.0;
  (*in_RDI)[1] = 0.0;
  (*in_RDI)[2] = 0.0;
  (*in_RDI)[3] = 0.0;
  in_RDI[1][0] = 0.0;
  in_RDI[1][2] = 0.0;
  in_RDI[1][3] = 0.0;
  in_RDI[2][0] = 0.0;
  in_RDI[2][1] = 0.0;
  in_RDI[2][3] = 0.0;
  in_RDI[3][0] = 0;
  *(undefined8 *)((long)(in_RDI + 3) + 8) = 0;
  *(undefined8 *)((long)(in_RDI + 3) + 0x10) = 0;
  for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
    dVar1 = this->d[lVar6][0];
    dVar2 = this->d[lVar6][1];
    dVar3 = this->d[lVar6][2];
    dVar4 = this->d[lVar6][3];
    for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
      (*(double (*) [4])*in_RDI)[lVar7] =
           m->d[3][lVar7] * dVar4 +
           m->d[2][lVar7] * dVar3 + m->d[0][lVar7] * dVar1 + m->d[1][lVar7] * dVar2;
    }
    in_RDI = in_RDI + 1;
  }
  return (Mat4x4 *)padVar5;
}

Assistant:

inline Mat4x4 operator*(const Mat4x4& m) const {
        Mat4x4 _m;
        for (int i = 0; i < 4; ++i)
            for (int j = 0; j < 4; ++j)
                _m.d[i][j] = d[i][0] * m.d[0][j] + d[i][1] * m.d[1][j] +
                             d[i][2] * m.d[2][j] + d[i][3] * m.d[3][j];
        return _m;
    }